

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdD3D56TexOffset::emulate_mthd(MthdD3D56TexOffset *this)

{
  MthdD3D56TexOffset *this_local;
  
  if ((this->which & 1U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[0] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffffbfff |
         0x4000;
  }
  if ((this->which & 2U) != 0) {
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.misc32[1] =
         (this->super_SingleMthdTest).super_MthdTest.val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[1] & 0xffbfffff |
         0x400000;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (which & 1) {
			exp.misc32[0] = val;
			insrt(exp.valid[1], 14, 1, 1);
		}
		if (which & 2) {
			exp.misc32[1] = val;
			insrt(exp.valid[1], 22, 1, 1);
		}
	}